

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.hpp
# Opt level: O2

void __thiscall beast::unit_test::runner::~runner(runner *this)

{
  this->_vptr_runner = (_func_int **)&PTR__runner_002f7360;
  ::std::__cxx11::string::~string((string *)&this->arg_);
  return;
}

Assistant:

virtual ~runner() = default;